

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btSoftBody::RContact>::push_back
          (btAlignedObjectArray<btSoftBody::RContact> *this,RContact *_Val)

{
  int iVar1;
  int iVar2;
  btAlignedObjectArray<btSoftBody::RContact> *in_RSI;
  RContact *in_RDI;
  int sz;
  RContact *in_stack_ffffffffffffffd8;
  int _Count;
  
  iVar1 = size((btAlignedObjectArray<btSoftBody::RContact> *)in_RDI);
  _Count = iVar1;
  iVar2 = capacity((btAlignedObjectArray<btSoftBody::RContact> *)in_RDI);
  if (iVar1 == iVar2) {
    iVar1 = size((btAlignedObjectArray<btSoftBody::RContact> *)in_RDI);
    allocSize((btAlignedObjectArray<btSoftBody::RContact> *)in_RDI,iVar1);
    reserve(in_RSI,_Count);
  }
  btSoftBody::RContact::RContact(in_RDI,in_stack_ffffffffffffffd8);
  *(int *)((long)&(in_RDI->m_cti).m_colObj + 4) = *(int *)((long)&(in_RDI->m_cti).m_colObj + 4) + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void push_back(const T& _Val)
		{	
			const BT_REGISTER int sz = size();
			if( sz == capacity() )
			{
				reserve( allocSize(size()) );
			}
			
#ifdef BT_USE_PLACEMENT_NEW
			new ( &m_data[m_size] ) T(_Val);
#else
			m_data[size()] = _Val;			
#endif //BT_USE_PLACEMENT_NEW

			m_size++;
		}